

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

ON_ModelComponentReference __thiscall
ON_ModelComponentReference::CreateConstantSystemComponentReference
          (ON_ModelComponentReference *this,ON_ModelComponent *system_model_component)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ON_ModelComponentReference OVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if ((system_model_component->m_content_version_number == 0) &&
     ((short)system_model_component->m_locked_status < 0)) {
    OVar2 = CreateForExperts(this,system_model_component,false);
    _Var1._M_pi = OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0xf33,"","Invalid system_model_component parameter.");
    ON_ModelComponentReference(this,&Empty);
    _Var1._M_pi = extraout_RDX;
  }
  OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar2.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ON_ModelComponentReference::CreateConstantSystemComponentReference(
  const class ON_ModelComponent& system_model_component
  ) ON_NOEXCEPT
{
  if ( system_model_component.IsSystemComponent())
    return CreateForExperts(const_cast<ON_ModelComponent*>(&system_model_component),false);

  ON_ERROR("Invalid system_model_component parameter.");
  return ON_ModelComponentReference::Empty;
}